

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O0

void Kit_TruthCofSupports
               (Vec_Int_t *vBddDir,Vec_Int_t *vBddInv,int nVars,Vec_Int_t *vMemory,uint *puSupps)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Kit_Mux_t KVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  int nSupps;
  int Entry;
  int Var;
  int v;
  int i;
  uint *pFan1;
  uint *pFan0;
  uint *pThis;
  uint *puSuppAll;
  Kit_Mux_t Mux;
  uint *puSupps_local;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  Vec_Int_t *vBddInv_local;
  Vec_Int_t *vBddDir_local;
  
  pFan0 = (uint *)0x0;
  iVar2 = nVars * 2;
  iVar3 = Vec_IntSize(vMemory);
  iVar4 = Vec_IntSize(vBddDir);
  if (iVar3 < iVar2 * iVar4) {
    iVar3 = Vec_IntSize(vBddDir);
    Vec_IntGrow(vMemory,iVar2 * iVar3);
  }
  piVar9 = Vec_IntArray(vMemory);
  memset(piVar9,0,(long)iVar2 << 2);
  Var = 1;
  while( true ) {
    iVar3 = Vec_IntSize(vBddDir);
    if (iVar3 <= Var) {
      memcpy(puSupps,pFan0,(long)iVar2 << 2);
      iVar3 = Vec_IntSize(vMemory);
      iVar4 = Vec_IntSize(vBddInv);
      if (iVar3 < iVar2 * iVar4) {
        iVar3 = Vec_IntSize(vBddInv);
        Vec_IntGrow(vMemory,iVar2 * iVar3);
      }
      piVar9 = Vec_IntArray(vMemory);
      memset(piVar9,0,(long)iVar2 << 2);
      Var = 1;
      while( true ) {
        iVar3 = Vec_IntSize(vBddInv);
        if (iVar3 <= Var) {
          for (nSupps = 0; nSupps < iVar2; nSupps = nSupps + 1) {
            uVar6 = puSupps[nSupps];
            uVar7 = Kit_BitMask(nSupps / 2);
            uVar1 = pFan0[nSupps];
            uVar8 = Kit_BitMask(nSupps / 2);
            puSupps[nSupps] = uVar6 & uVar7 | uVar1 & (uVar8 ^ 0xffffffff);
          }
          return;
        }
        iVar3 = Vec_IntEntry(vBddInv,Var);
        KVar5 = Kit_Int2Mux(iVar3);
        uVar6 = (uint)KVar5 & 0x1f;
        iVar3 = iVar2 * ((uint)KVar5 >> 0x11 & 0xfff);
        iVar4 = iVar2 * ((uint)KVar5 >> 5 & 0xfff);
        pFan0 = (uint *)(piVar9 + iVar2 * Var);
        for (Entry = 0; Entry < iVar2; Entry = Entry + 1) {
          pFan0[Entry] = piVar9[(long)iVar3 + (long)Entry] | piVar9[(long)iVar4 + (long)Entry] |
                         1 << (sbyte)uVar6;
        }
        if (piVar9[(long)iVar3 + (long)(int)(uVar6 << 1)] !=
            piVar9[(long)iVar3 + (long)(int)(uVar6 * 2 + 1)]) break;
        if (piVar9[(long)iVar4 + (long)(int)(uVar6 << 1)] !=
            piVar9[(long)iVar4 + (long)(int)(uVar6 * 2 + 1)]) {
          __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                        ,0x16a,
                        "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                       );
        }
        pFan0[(int)(uVar6 << 1)] = piVar9[(long)iVar3 + (long)(int)(uVar6 << 1)];
        pFan0[(int)(uVar6 * 2 + 1)] = piVar9[(long)iVar4 + (long)(int)(uVar6 << 1)];
        Var = Var + 1;
      }
      __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                    ,0x169,
                    "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                   );
    }
    iVar3 = Vec_IntEntry(vBddDir,Var);
    KVar5 = Kit_Int2Mux(iVar3);
    iVar3 = (nVars + -1) - ((uint)KVar5 & 0x1f);
    iVar4 = iVar2 * ((uint)KVar5 >> 0x11 & 0xfff);
    iVar10 = iVar2 * ((uint)KVar5 >> 5 & 0xfff);
    pFan0 = (uint *)(piVar9 + iVar2 * Var);
    for (Entry = 0; Entry < iVar2; Entry = Entry + 1) {
      pFan0[Entry] = piVar9[(long)iVar4 + (long)Entry] | piVar9[(long)iVar10 + (long)Entry] |
                     1 << ((byte)iVar3 & 0x1f);
    }
    if (piVar9[(long)iVar4 + (long)(iVar3 * 2)] != piVar9[(long)iVar4 + (long)(iVar3 * 2 + 1)])
    break;
    if (piVar9[(long)iVar10 + (long)(iVar3 * 2)] != piVar9[(long)iVar10 + (long)(iVar3 * 2 + 1)]) {
      __assert_fail("pFan1[2*Var + 0] == pFan1[2*Var + 1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                    ,0x150,
                    "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
                   );
    }
    pFan0[iVar3 * 2] = piVar9[(long)iVar4 + (long)(iVar3 * 2)];
    pFan0[iVar3 * 2 + 1] = piVar9[(long)iVar10 + (long)(iVar3 * 2)];
    Var = Var + 1;
  }
  __assert_fail("pFan0[2*Var + 0] == pFan0[2*Var + 1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitCloud.c"
                ,0x14f,
                "void Kit_TruthCofSupports(Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, unsigned int *)"
               );
}

Assistant:

void Kit_TruthCofSupports( Vec_Int_t * vBddDir, Vec_Int_t * vBddInv, int nVars, Vec_Int_t * vMemory, unsigned * puSupps )
{
    Kit_Mux_t Mux;
    unsigned * puSuppAll;
    unsigned * pThis = NULL; // Suppress "might be used uninitialized"
    unsigned * pFan0, * pFan1;
    int i, v, Var, Entry, nSupps;
    nSupps = 2 * nVars;

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddDir) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddDir) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddDir, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
        Var = nVars - 1 - Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }
    // copy the result
    memcpy( puSupps, pThis, sizeof(unsigned) * nSupps );
    // compute the inverse

    // extend storage
    if ( Vec_IntSize( vMemory ) < nSupps * Vec_IntSize(vBddInv) )
        Vec_IntGrow( vMemory, nSupps * Vec_IntSize(vBddInv) );
    puSuppAll = (unsigned *)Vec_IntArray( vMemory );
    // clear storage for the const node
    memset( puSuppAll, 0, sizeof(unsigned) * nSupps );
    // compute supports from nodes
    Vec_IntForEachEntryStart( vBddInv, Entry, i, 1 )
    {
        Mux = Kit_Int2Mux(Entry);
//        Var = nVars - 1 - Mux.v;
        Var = Mux.v;
        pFan0 = puSuppAll + nSupps * Mux.e;
        pFan1 = puSuppAll + nSupps * Mux.t;
        pThis = puSuppAll + nSupps * i;
        for ( v = 0; v < nSupps; v++ )
            pThis[v] = pFan0[v] | pFan1[v] | (1<<Var);
        assert( pFan0[2*Var + 0] == pFan0[2*Var + 1] );
        assert( pFan1[2*Var + 0] == pFan1[2*Var + 1] );
        pThis[2*Var + 0] = pFan0[2*Var + 0];// | pFan0[2*Var + 1];
        pThis[2*Var + 1] = pFan1[2*Var + 0];// | pFan1[2*Var + 1];
    }

    // merge supports
    for ( Var = 0; Var < nSupps; Var++ )
        puSupps[Var] = (puSupps[Var] & Kit_BitMask(Var/2)) | (pThis[Var] & ~Kit_BitMask(Var/2));
}